

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

void search_in_and_exp_files(string *path,list<int,_std::allocator<int>_> *files_to_run)

{
  size_t *this;
  long lVar1;
  char *pcVar2;
  allocator *paVar3;
  bool bVar4;
  int iVar5;
  char *__src;
  DIR *__dirp;
  reference pvVar6;
  reference piVar7;
  string *psVar8;
  undefined8 uStack_2d0;
  string *local_2c8;
  string *local_2c0;
  string *local_2b8;
  char *local_2b0;
  allocator *local_2a8;
  dirent *local_2a0;
  char *local_298;
  DIR *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string i_1;
  iterator iStack_200;
  int exp;
  iterator __end1_1;
  iterator __begin1_1;
  list<int,_std::allocator<int>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string i;
  iterator iStack_100;
  int in;
  iterator __end1;
  iterator __begin1;
  list<int,_std::allocator<int>_> *__range1;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_c8;
  allocator local_a1;
  undefined1 local_a0 [8];
  string file_name;
  DIR *dir;
  unsigned_long __vla_expr0;
  undefined1 local_50 [4];
  int length;
  list<int,_std::allocator<int>_> exp_files;
  list<int,_std::allocator<int>_> in_files;
  dirent *entry;
  list<int,_std::allocator<int>_> *files_to_run_local;
  string *path_local;
  
  uStack_2d0 = 0x109a8c;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)
             &exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
  uStack_2d0 = 0x109a95;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)local_50);
  uStack_2d0 = 0x109a9e;
  iVar5 = std::__cxx11::string::size();
  lVar1 = -((ulong)(iVar5 + 1) + 0xf & 0xfffffffffffffff0);
  local_298 = (char *)((long)&local_2c8 + lVar1);
  *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109ad5;
  __src = (char *)std::__cxx11::string::c_str();
  pcVar2 = local_298;
  *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109ae4;
  strcpy(pcVar2,__src);
  pcVar2 = local_298;
  *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109af0;
  __dirp = opendir(pcVar2);
  local_290 = __dirp;
  if (__dirp == (DIR *)0x0) {
    file_name.field_2._8_4_ = 1;
  }
  else {
    while( true ) {
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109b33;
      local_2a0 = readdir(__dirp);
      if (local_2a0 == (dirent *)0x0) break;
      local_2b0 = local_2a0->d_name;
      local_2a8 = &local_a1;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109b73;
      std::allocator<char>::allocator();
      paVar3 = local_2a8;
      pcVar2 = local_2b0;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109b8d;
      std::__cxx11::string::string((string *)local_a0,pcVar2,paVar3);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109b9b;
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109bb3;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_c8,"^in([0-9]+)\\.txt$",0x10);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109bcc;
      add_file_if_regex_ok
                (&local_c8,
                 (list<int,_std::allocator<int>_> *)
                 &exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size,
                 (string *)local_a0);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109bda;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_c8);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109bf2;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1,
                 "^exp([0-9]+)\\.txt$",0x10);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109c0b;
      add_file_if_regex_ok
                ((regex *)&__range1,(list<int,_std::allocator<int>_> *)local_50,(string *)local_a0);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109c19;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109c25;
      std::__cxx11::string::~string((string *)local_a0);
    }
    *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109ca1;
    closedir(__dirp);
    *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109cac;
    std::__cxx11::list<int,_std::allocator<int>_>::sort
              ((list<int,_std::allocator<int>_> *)
               &exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
    *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109cb7;
    std::__cxx11::list<int,_std::allocator<int>_>::sort((list<int,_std::allocator<int>_> *)local_50)
    ;
    this = &exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109cd0;
    __end1 = std::__cxx11::list<int,_std::allocator<int>_>::begin
                       ((list<int,_std::allocator<int>_> *)this);
    *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109ce3;
    iStack_100 = std::__cxx11::list<int,_std::allocator<int>_>::end
                           ((list<int,_std::allocator<int>_> *)this);
    while( true ) {
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109cfd;
      bVar4 = std::operator!=(&__end1,&stack0xffffffffffffff00);
      if (!bVar4) break;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109d12;
      piVar7 = std::_List_iterator<int>::operator*(&__end1);
      iVar5 = *piVar7;
      i.field_2._12_4_ = iVar5;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109d2c;
      std::__cxx11::to_string((string *)local_128,iVar5);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109d37;
      pvVar6 = std::__cxx11::list<int,_std::allocator<int>_>::front
                         ((list<int,_std::allocator<int>_> *)local_50);
      if (*pvVar6 == i.field_2._12_4_) {
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109d51;
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  (files_to_run,(value_type_conflict *)(i.field_2._M_local_buf + 0xc));
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109d5c;
        std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                  ((list<int,_std::allocator<int>_> *)local_50);
      }
      else {
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109d7b;
        bVar4 = std::__cxx11::list<int,_std::allocator<int>_>::empty
                          ((list<int,_std::allocator<int>_> *)local_50);
        if (!bVar4) {
          *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109d88;
          pvVar6 = std::__cxx11::list<int,_std::allocator<int>_>::front
                             ((list<int,_std::allocator<int>_> *)local_50);
          if (*pvVar6 <= (int)i.field_2._12_4_) {
            while( true ) {
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109e9e;
              pvVar6 = std::__cxx11::list<int,_std::allocator<int>_>::front
                                 ((list<int,_std::allocator<int>_> *)local_50);
              if ((int)i.field_2._12_4_ <= *pvVar6) break;
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109ec6;
              std::operator+(&local_1c8,".txt is present, but in",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109ee2;
              std::operator+(&local_1a8,&local_1c8,".txt missing -> Skipping test!\n");
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109efe;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range1_1,"exp",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109f13;
              psVar8 = (string *)
                       std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_1a8);
              local_2c0 = psVar8;
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109f2d;
              write_colored_text(psVar8,red);
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109f3b;
              std::__cxx11::string::~string((string *)&__range1_1);
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109f47;
              std::__cxx11::string::~string((string *)&local_1a8);
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109f53;
              std::__cxx11::string::~string((string *)&local_1c8);
              *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109f5c;
              std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                        ((list<int,_std::allocator<int>_> *)local_50);
            }
            goto LAB_00109fb3;
          }
        }
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109db0;
        std::operator+(&local_168,".txt is present, but exp",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128);
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109dcc;
        std::operator+(&local_148,&local_168,".txt missing -> Skipping test!\n");
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109de8;
        std::operator+(&local_188,"in",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128);
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109dfd;
        psVar8 = (string *)
                 std::__cxx11::string::operator+=((string *)&local_188,(string *)&local_148);
        local_2b8 = psVar8;
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109e17;
        write_colored_text(psVar8,red);
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109e25;
        std::__cxx11::string::~string((string *)&local_188);
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109e31;
        std::__cxx11::string::~string((string *)&local_148);
        *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109e3d;
        std::__cxx11::string::~string((string *)&local_168);
      }
LAB_00109fb3:
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109fbf;
      std::__cxx11::string::~string((string *)local_128);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109fcb;
      std::_List_iterator<int>::operator++(&__end1);
    }
    *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x109ff8;
    __end1_1 = std::__cxx11::list<int,_std::allocator<int>_>::begin
                         ((list<int,_std::allocator<int>_> *)local_50);
    *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a00b;
    iStack_200 = std::__cxx11::list<int,_std::allocator<int>_>::end
                           ((list<int,_std::allocator<int>_> *)local_50);
    while( true ) {
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a025;
      bVar4 = std::operator!=(&__end1_1,&stack0xfffffffffffffe00);
      if (!bVar4) break;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a03a;
      piVar7 = std::_List_iterator<int>::operator*(&__end1_1);
      iVar5 = *piVar7;
      i_1.field_2._12_4_ = iVar5;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a054;
      std::__cxx11::to_string((string *)local_228,iVar5);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a070;
      std::operator+(&local_268,".txt is present, but in",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228)
      ;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a08c;
      std::operator+(&local_248,&local_268,".txt missing -> Skipping test!\n");
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a0a8;
      std::operator+(&local_288,"exp",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228)
      ;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a0bd;
      psVar8 = (string *)std::__cxx11::string::operator+=((string *)&local_288,(string *)&local_248)
      ;
      local_2c8 = psVar8;
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a0d7;
      write_colored_text(psVar8,red);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a0e5;
      std::__cxx11::string::~string((string *)&local_288);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a0f1;
      std::__cxx11::string::~string((string *)&local_248);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a0fd;
      std::__cxx11::string::~string((string *)&local_268);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a109;
      std::__cxx11::string::~string((string *)local_228);
      *(undefined8 *)((long)&uStack_2d0 + lVar1) = 0x10a115;
      std::_List_iterator<int>::operator++(&__end1_1);
    }
    file_name.field_2._8_4_ = 0;
  }
  uStack_2d0 = 0x10a199;
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_50);
  uStack_2d0 = 0x10a1a2;
  std::__cxx11::list<int,_std::allocator<int>_>::~list
            ((list<int,_std::allocator<int>_> *)
             &exp_files.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
  return;
}

Assistant:

void search_in_and_exp_files(const string &path, list<int> &files_to_run) {
    struct dirent *entry;

    list<int> in_files;
    list<int> exp_files;

    // Convert string to char-array
    int length = path.size();
    char char_path[length + 1];
    strcpy(char_path, path.c_str());

    // Open the directory
    DIR *dir = opendir(char_path);
    if (dir == nullptr) return;

    // Read each filename from the directory
    while ((entry = readdir(dir)) != nullptr) {
        string file_name = entry->d_name;

        /*
         * I just want to search for in1.txt, in2.txt, ..., in15.txt, in16.txt, ...
         * And I just want to extract the number 1, 2, ..., 15, 16, ..
         * See https://regex101.com for nice interactive explaining of the regex.
         * - ^      -> must start with what follows
         * - ^in    -> must start with 'in'
         * - (...)  -> first capture group -> get with $1
         * - [0-9]+ -> at least one digit
         * - \\.    -> a dot has to be present (note: in many languages, just one \ is required, also on https://regex101.com/)
         * - txt$   -> must end with txt
         */
        add_file_if_regex_ok(regex("^in([0-9]+)\\.txt$"), in_files, file_name);
        add_file_if_regex_ok(regex("^exp([0-9]+)\\.txt$"), exp_files, file_name);
    }
    closedir(dir);

    // Sort the file-lists
    in_files.sort();
    exp_files.sort();

    // Only add files to 'files_to_run', if the inXX.txt AND the expXX.txt are present:
    for (int in : in_files) {
        string i = to_string(in);
        if (exp_files.front() == in) {
            files_to_run.push_back(in);
            exp_files.pop_front();
        } else if (exp_files.empty() || exp_files.front() > in) {
            write_colored_text("in" + i += ".txt is present, but exp" + i + ".txt missing -> Skipping test!\n");
        } else {
            while (exp_files.front() < in) {
                write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
                exp_files.pop_front();
            }
        }
    }
    // Possibly remaining exp-files (without in-files):
    for (int exp: exp_files) {
        string i = to_string(exp);
        write_colored_text("exp" + i += ".txt is present, but in" + i + ".txt missing -> Skipping test!\n");
    }
}